

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

size_t ServerNetworkLayerTCP_getJobs(UA_ServerNetworkLayer *nl,UA_Job **jobs,UA_UInt16 timeout)

{
  ServerNetworkLayerTCP *layer_00;
  UA_Connection *pUVar1;
  undefined4 uVar2;
  int sockfd;
  UA_StatusCode UVar3;
  ConnectionMapping *pCVar4;
  ConnectionMapping *pCVar5;
  UA_Connection *c;
  ulong uStack_188;
  UA_StatusCode retval;
  size_t i_1;
  size_t j;
  UA_ByteString buf;
  int i;
  int newsockfd;
  UA_Int32 resultsize;
  timeval tmptv;
  undefined1 local_140 [4];
  UA_Int32 highestfd;
  fd_set errset;
  fd_set fdset;
  size_t totalJobs;
  UA_Job *js;
  ServerNetworkLayerTCP *layer;
  UA_UInt16 timeout_local;
  UA_Job **jobs_local;
  UA_ServerNetworkLayer *nl_local;
  
  layer_00 = (ServerNetworkLayerTCP *)nl->handle;
  totalJobs = (size_t)malloc(layer_00->mappingsSize << 6);
  if ((UA_Job *)totalJobs == (UA_Job *)0x0) {
    nl_local = (UA_ServerNetworkLayer *)0x80030000;
  }
  else {
    fdset.fds_bits[0xf] = removeClosedConnections(layer_00,(UA_Job *)totalJobs);
    tmptv.tv_usec._4_4_ = setFDSet(layer_00,(fd_set *)(errset.fds_bits + 0xf));
    setFDSet(layer_00,(fd_set *)local_140);
    _newsockfd = 0;
    tmptv.tv_sec = (__time_t)(int)((uint)timeout * 1000);
    i = select(tmptv.tv_usec._4_4_ + 1,(fd_set *)(errset.fds_bits + 0xf),(fd_set *)0x0,
               (fd_set *)local_140,(timeval *)&newsockfd);
    if ((fdset.fds_bits[0xf] == 0) && (i < 1)) {
      free((void *)totalJobs);
      *jobs = (UA_Job *)0x0;
      nl_local = (UA_ServerNetworkLayer *)0x0;
    }
    else {
      if ((errset.fds_bits[(long)(layer_00->serversockfd / 0x40) + 0xf] &
          1L << ((byte)((long)layer_00->serversockfd % 0x40) & 0x3f)) != 0) {
        i = i + -1;
        sockfd = accept(layer_00->serversockfd,(sockaddr *)0x0,(socklen_t *)0x0);
        if (-1 < sockfd) {
          socket_set_nonblocking(sockfd);
          buf.data._4_4_ = 1;
          setsockopt(sockfd,6,1,(void *)((long)&buf.data + 4),4);
          ServerNetworkLayerTCP_add(layer_00,sockfd);
        }
      }
      j = 0;
      buf.length = (size_t)(UA_Byte *)0x0;
      i_1 = 0;
      for (uStack_188 = 0; uStack_188 < layer_00->mappingsSize && i_1 < (ulong)(long)i;
          uStack_188 = uStack_188 + 1) {
        if (((*(ulong *)(local_140 + (long)(layer_00->mappings[uStack_188].sockfd / 0x40) * 8) &
             1L << ((byte)((long)layer_00->mappings[uStack_188].sockfd % 0x40) & 0x3f)) != 0) ||
           ((errset.fds_bits[(long)(layer_00->mappings[uStack_188].sockfd / 0x40) + 0xf] &
            1L << ((byte)((long)layer_00->mappings[uStack_188].sockfd % 0x40) & 0x3f)) != 0)) {
          UVar3 = socket_recv(layer_00->mappings[uStack_188].connection,(UA_ByteString *)&j,0);
          if (UVar3 == 0) {
            (((UA_Job *)(totalJobs + (fdset.fds_bits[0xf] + i_1) * 0x20))->job).closeConnection =
                 layer_00->mappings[uStack_188].connection;
            (((UA_Job *)(totalJobs + (fdset.fds_bits[0xf] + i_1) * 0x20))->job).binaryMessage.
            message.length = j;
            (((UA_Job *)(totalJobs + (fdset.fds_bits[0xf] + i_1) * 0x20))->job).binaryMessage.
            message.data = (UA_Byte *)buf.length;
            ((UA_Job *)(totalJobs + (fdset.fds_bits[0xf] + i_1) * 0x20))->type =
                 UA_JOBTYPE_BINARYMESSAGE_NETWORKLAYER;
            i_1 = i_1 + 1;
          }
          else if (UVar3 == 0x80ae0000) {
            pUVar1 = layer_00->mappings[uStack_188].connection;
            UA_LOG_INFO(layer_00->logger,UA_LOGCATEGORY_NETWORK,
                        "Connection %i | Connection closed from remote",(ulong)(uint)pUVar1->sockfd)
            ;
            ((UA_Job *)(totalJobs + (fdset.fds_bits[0xf] + i_1) * 0x20))->type =
                 UA_JOBTYPE_DETACHCONNECTION;
            (((UA_Job *)(totalJobs + (fdset.fds_bits[0xf] + i_1) * 0x20))->job).closeConnection =
                 pUVar1;
            pCVar4 = layer_00->mappings + uStack_188;
            pCVar5 = layer_00->mappings + (layer_00->mappingsSize - 1);
            pCVar4->connection = pCVar5->connection;
            uVar2 = *(undefined4 *)&pCVar5->field_0xc;
            pCVar4->sockfd = pCVar5->sockfd;
            *(undefined4 *)&pCVar4->field_0xc = uVar2;
            layer_00->mappingsSize = layer_00->mappingsSize - 1;
            fdset.fds_bits[0xf] = fdset.fds_bits[0xf] + 1;
            ((UA_Job *)(totalJobs + (fdset.fds_bits[0xf] + i_1) * 0x20))->type =
                 UA_JOBTYPE_METHODCALL_DELAYED;
            (((UA_Job *)(totalJobs + (fdset.fds_bits[0xf] + i_1) * 0x20))->job).methodCall.method =
                 FreeConnectionCallback;
            (((UA_Job *)(totalJobs + (fdset.fds_bits[0xf] + i_1) * 0x20))->job).closeConnection =
                 pUVar1;
            i_1 = i_1 + 1;
          }
        }
      }
      nl_local = (UA_ServerNetworkLayer *)(i_1 + fdset.fds_bits[0xf]);
      if (nl_local == (UA_ServerNetworkLayer *)0x0) {
        free((void *)totalJobs);
        totalJobs = 0;
      }
      *jobs = (UA_Job *)totalJobs;
    }
  }
  return (size_t)nl_local;
}

Assistant:

static size_t
ServerNetworkLayerTCP_getJobs(UA_ServerNetworkLayer *nl, UA_Job **jobs,
                              UA_UInt16 timeout) {
    /* Every open socket can generate two jobs */
    ServerNetworkLayerTCP *layer = nl->handle;
    UA_Job *js = malloc(sizeof(UA_Job) * (size_t)((layer->mappingsSize * 2)));
    if(!js)
        return UA_STATUSCODE_BADOUTOFMEMORY;

    /* Remove closed sockets */
    size_t totalJobs = removeClosedConnections(layer, js);

    /* Listen on open sockets (including the server) */
    fd_set fdset, errset;
    UA_Int32 highestfd = setFDSet(layer, &fdset);
    setFDSet(layer, &errset);
    struct timeval tmptv = {0, timeout * 1000};
    UA_Int32 resultsize = select(highestfd+1, &fdset, NULL, &errset, &tmptv);
    if(totalJobs == 0 && resultsize <= 0) {
        free(js);
        *jobs = NULL;
        return 0;
    }

    /* Accept new connection via the server socket (can only be a single one) */
    if(UA_fd_isset(layer->serversockfd, &fdset)) {
        --resultsize;
        SOCKET newsockfd = accept((SOCKET)layer->serversockfd, NULL, NULL);
#ifdef _WIN32
        if(newsockfd != INVALID_SOCKET)
#else
        if(newsockfd >= 0)
#endif
        {
            socket_set_nonblocking(newsockfd);
            /* Do not merge packets on the socket (disable Nagle's algorithm) */
            int i = 1;
            setsockopt(newsockfd, IPPROTO_TCP, TCP_NODELAY, (void *)&i, sizeof(i));
            ServerNetworkLayerTCP_add(layer, (UA_Int32)newsockfd);
        }
    }

    /* Read from established sockets */
    UA_ByteString buf = UA_BYTESTRING_NULL;
    size_t j = 0;
    for(size_t i = 0; i < layer->mappingsSize && j < (size_t)resultsize; ++i) {
        if(!UA_fd_isset(layer->mappings[i].sockfd, &errset) &&
           !UA_fd_isset(layer->mappings[i].sockfd, &fdset))
          continue;

        UA_StatusCode retval = socket_recv(layer->mappings[i].connection, &buf, 0);
        if(retval == UA_STATUSCODE_GOOD) {
            js[totalJobs + j].job.binaryMessage.connection = layer->mappings[i].connection;
            js[totalJobs + j].job.binaryMessage.message = buf;
            js[totalJobs + j].type = UA_JOBTYPE_BINARYMESSAGE_NETWORKLAYER;
            ++j;
        } else if (retval == UA_STATUSCODE_BADCONNECTIONCLOSED) {
            UA_Connection *c = layer->mappings[i].connection;
            UA_LOG_INFO(layer->logger, UA_LOGCATEGORY_NETWORK,
                        "Connection %i | Connection closed from remote", c->sockfd);
            /* the socket was closed from remote */
            js[totalJobs + j].type = UA_JOBTYPE_DETACHCONNECTION;
            js[totalJobs + j].job.closeConnection = c;
            layer->mappings[i] = layer->mappings[layer->mappingsSize-1];
            --layer->mappingsSize;
            ++totalJobs; /* increase j only once */
            js[totalJobs + j].type = UA_JOBTYPE_METHODCALL_DELAYED;
            js[totalJobs + j].job.methodCall.method = FreeConnectionCallback;
            js[totalJobs + j].job.methodCall.data = c;
            ++j;
        }
    }
    totalJobs += j;

    if(totalJobs == 0) {
        free(js);
        js = NULL;
    }
    *jobs = js;
    return totalJobs;
}